

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypergraph.cpp
# Opt level: O0

void __thiscall Hypergraph::Hypergraph(Hypergraph *this,Hypergraph *other)

{
  Hypergraph *other_local;
  Hypergraph *this_local;
  
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&this->m_edges);
  enumerate_configuration::enumerate_configuration(&this->m_configuration);
  Table::Table(&this->m_hitting_set_stats);
  Table::Table(&this->m_oracle_stats);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->m_hitting_set_timestamp);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->m_oracle_timestamp);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->m_oracle_bf_timestamp);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::operator=(&this->m_edges,&other->m_edges);
  this->m_num_vertices = other->m_num_vertices;
  return;
}

Assistant:

Hypergraph::Hypergraph(const Hypergraph &other) {
	m_edges = other.m_edges;
	m_num_vertices = other.m_num_vertices;
}